

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_Error BDF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  undefined2 uVar1;
  FT_Face pFVar2;
  undefined1 local_78 [4];
  int bpp;
  bdf_glyph_t glyph;
  FT_Bitmap *bitmap;
  FT_Error error;
  FT_Face face;
  BDF_Face bdf;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size size_local;
  FT_GlyphSlot slot_local;
  
  pFVar2 = size->face;
  bitmap._4_4_ = 0;
  glyph._48_8_ = &slot->bitmap;
  uVar1 = *(undefined2 *)(pFVar2[1].face_flags + 0x880f2);
  if (pFVar2 == (FT_Face)0x0) {
    bitmap._4_4_ = 0x23;
  }
  else if (glyph_index < (uint)pFVar2->num_glyphs) {
    if (glyph_index == 0) {
      bdf._4_4_ = pFVar2[1].num_fixed_sizes;
    }
    else {
      bdf._4_4_ = glyph_index - 1;
    }
    memcpy(local_78,(void *)(*(long *)(pFVar2[1].face_flags + 0x60) + (ulong)bdf._4_4_ * 0x38),0x38)
    ;
    *(uint *)glyph._48_8_ = (uint)glyph.encoding._6_2_;
    *(uint *)(glyph._48_8_ + 4) = (uint)glyph.encoding._4_2_;
    *(undefined4 *)(glyph._48_8_ + 8) = glyph.bitmap._0_4_;
    ft_glyphslot_set_bitmap(slot,(FT_Byte *)glyph.bbx._4_8_);
    switch(uVar1) {
    case 1:
      *(undefined1 *)(glyph._48_8_ + 0x1a) = 1;
      break;
    case 2:
      *(undefined1 *)(glyph._48_8_ + 0x1a) = 3;
      break;
    case 4:
      *(undefined1 *)(glyph._48_8_ + 0x1a) = 4;
      break;
    case 8:
      *(undefined1 *)(glyph._48_8_ + 0x1a) = 2;
      *(undefined2 *)(glyph._48_8_ + 0x18) = 0x100;
    }
    slot->format = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = (int)(short)glyph.swidth;
    slot->bitmap_top = (int)(short)glyph.bbx.width;
    (slot->metrics).horiAdvance = (long)(int)((uint)glyph.encoding._2_2_ << 6);
    (slot->metrics).horiBearingX = (long)((int)(short)glyph.swidth << 6);
    (slot->metrics).horiBearingY = (long)((int)(short)glyph.bbx.width << 6);
    (slot->metrics).width = (ulong)(uint)(*(int *)(glyph._48_8_ + 4) << 6);
    (slot->metrics).height = (ulong)(uint)(*(int *)glyph._48_8_ << 6);
    ft_synthesize_vertical_metrics
              (&slot->metrics,(long)(int)((uint)*(ushort *)(pFVar2[1].face_flags + 10) << 6));
  }
  else {
    bitmap._4_4_ = 6;
  }
  return bitmap._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    BDF_Face     bdf    = (BDF_Face)FT_SIZE_FACE( size );
    FT_Face      face   = FT_FACE( bdf );
    FT_Error     error  = FT_Err_Ok;
    FT_Bitmap*   bitmap = &slot->bitmap;
    bdf_glyph_t  glyph;
    int          bpp    = bdf->bdffont->bpp;

    FT_UNUSED( load_flags );


    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "BDF_Glyph_Load: glyph index %d\n", glyph_index ));

    /* index 0 is the undefined glyph */
    if ( glyph_index == 0 )
      glyph_index = bdf->default_glyph;
    else
      glyph_index--;

    /* slot, bitmap => freetype, glyph => bdflib */
    glyph = bdf->bdffont->glyphs[glyph_index];

    bitmap->rows  = glyph.bbx.height;
    bitmap->width = glyph.bbx.width;
    if ( glyph.bpr > FT_INT_MAX )
      FT_TRACE1(( "BDF_Glyph_Load: too large pitch %d is truncated\n",
                   glyph.bpr ));
    bitmap->pitch = (int)glyph.bpr; /* same as FT_Bitmap.pitch */

    /* note: we don't allocate a new array to hold the bitmap; */
    /*       we can simply point to it                         */
    ft_glyphslot_set_bitmap( slot, glyph.bitmap );

    switch ( bpp )
    {
    case 1:
      bitmap->pixel_mode = FT_PIXEL_MODE_MONO;
      break;
    case 2:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY2;
      break;
    case 4:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY4;
      break;
    case 8:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY;
      bitmap->num_grays  = 256;
      break;
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = glyph.bbx.x_offset;
    slot->bitmap_top  = glyph.bbx.ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( glyph.dwidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( glyph.bbx.x_offset * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( glyph.bbx.ascent * 64 );
    slot->metrics.width        = (FT_Pos)( bitmap->width * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    /*
     * XXX DWIDTH1 and VVECTOR should be parsed and
     * used here, provided such fonts do exist.
     */
    ft_synthesize_vertical_metrics( &slot->metrics,
                                    bdf->bdffont->bbx.height * 64 );

  Exit:
    return error;
  }